

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofSpring2Constraint::calculateAngleInfo(btGeneric6DofSpring2Constraint *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  btScalar bVar16;
  btScalar bVar17;
  float fVar18;
  btScalar bVar19;
  float fVar20;
  btScalar bVar21;
  float fVar22;
  float fVar23;
  btScalar bVar24;
  btScalar bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  btMatrix3x3 local_38;
  
  fVar14 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
  fVar13 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
  fVar18 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
  fVar29 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
  fVar15 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
  fVar20 = fVar14 * fVar13 - fVar29 * fVar18;
  fVar30 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
  fVar28 = fVar18 * fVar15 - fVar13 * fVar30;
  fVar23 = fVar30 * fVar29 - fVar15 * fVar14;
  fVar31 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
  fVar1 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
  fVar26 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
  fVar32 = 1.0 / (fVar26 * fVar23 + fVar31 * fVar20 + fVar1 * fVar28);
  fVar20 = fVar20 * fVar32;
  fVar12 = (fVar26 * fVar29 - fVar13 * fVar1) * fVar32;
  fVar27 = (fVar1 * fVar18 - fVar14 * fVar26) * fVar32;
  fVar28 = fVar28 * fVar32;
  fVar22 = (fVar31 * fVar13 - fVar15 * fVar26) * fVar32;
  fVar26 = (fVar26 * fVar30 - fVar18 * fVar31) * fVar32;
  fVar23 = fVar23 * fVar32;
  fVar29 = (fVar1 * fVar15 - fVar29 * fVar31) * fVar32;
  fVar32 = (fVar31 * fVar14 - fVar30 * fVar1) * fVar32;
  fVar14 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
  fVar13 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
  fVar18 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
  local_38.m_el[0].m_floats[2] = fVar18 * fVar27 + fVar14 * fVar20 + fVar12 * fVar13;
  local_38.m_el[1].m_floats[2] = fVar18 * fVar26 + fVar14 * fVar28 + fVar22 * fVar13;
  local_38.m_el[2].m_floats[2] = fVar18 * fVar32 + fVar14 * fVar23 + fVar13 * fVar29;
  uVar2 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[0].m_floats;
  uVar3 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[1].m_floats;
  fVar30 = (float)uVar3;
  fVar31 = (float)((ulong)uVar3 >> 0x20);
  fVar18 = (float)uVar2;
  fVar15 = (float)((ulong)uVar2 >> 0x20);
  uVar2 = *(undefined8 *)(this->m_calculatedTransformB).m_basis.m_el[2].m_floats;
  fVar14 = (float)uVar2;
  fVar13 = (float)((ulong)uVar2 >> 0x20);
  local_38.m_el[0].m_floats[1] = fVar27 * fVar13 + fVar20 * fVar15 + fVar12 * fVar31;
  local_38.m_el[0].m_floats[0] = fVar27 * fVar14 + fVar20 * fVar18 + fVar12 * fVar30;
  local_38.m_el[0].m_floats[3] = 0.0;
  local_38.m_el[1].m_floats[1] = fVar26 * fVar13 + fVar28 * fVar15 + fVar22 * fVar31;
  local_38.m_el[1].m_floats[0] = fVar26 * fVar14 + fVar28 * fVar18 + fVar22 * fVar30;
  local_38.m_el[1].m_floats[3] = 0.0;
  local_38.m_el[2].m_floats[1] = fVar32 * fVar13 + fVar23 * fVar15 + fVar29 * fVar31;
  local_38.m_el[2].m_floats[0] = fVar32 * fVar14 + fVar23 * fVar18 + fVar29 * fVar30;
  local_38.m_el[2].m_floats[3] = 0.0;
  switch(this->m_rotateOrder) {
  case RO_XYZ:
    matrixToEulerXYZ(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_XZY:
    matrixToEulerXZY(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_YXZ:
    matrixToEulerYXZ(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_YZX:
    matrixToEulerYZX(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_ZXY:
    matrixToEulerZXY(&local_38,&this->m_calculatedAxisAngleDiff);
    break;
  case RO_ZYX:
    matrixToEulerZYX(&local_38,&this->m_calculatedAxisAngleDiff);
  }
  switch(this->m_rotateOrder) {
  case RO_XYZ:
    bVar16 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
    bVar17 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
    bVar19 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
    bVar21 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
    bVar24 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    bVar25 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    break;
  case RO_XZY:
    fVar14 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[0];
    bVar16 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[0];
    bVar17 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[0];
    bVar19 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
    bVar21 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    bVar24 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    goto LAB_00197a40;
  case RO_YXZ:
    fVar14 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[1];
    bVar16 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[1];
    bVar17 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[1];
    bVar19 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[2];
    bVar21 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[2];
    bVar24 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[2];
    goto LAB_00197902;
  case RO_YZX:
    fVar14 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
    bVar16 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    bVar17 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
    bVar19 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[1];
    bVar21 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[1];
    bVar24 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[1];
LAB_00197a40:
    fVar29 = bVar24 * bVar16 - bVar21 * bVar17;
    fVar15 = bVar19 * bVar17 - bVar24 * fVar14;
    auVar8._4_4_ = fVar15;
    auVar8._0_4_ = fVar29;
    auVar8._8_4_ = fVar14 * bVar21 - bVar19 * bVar16;
    auVar8._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[2].m_floats = auVar8;
    fVar13 = this->m_calculatedAxis[2].m_floats[2];
    auVar5._4_4_ = bVar24 * fVar29 - fVar13 * bVar19;
    auVar5._0_4_ = bVar21 * fVar13 - fVar15 * bVar24;
    auVar5._8_4_ = bVar19 * fVar15 - fVar29 * bVar21;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar5;
    fVar18 = fVar15 * bVar17 - bVar16 * fVar13;
    fVar13 = fVar14 * fVar13 - bVar17 * fVar29;
    fVar14 = bVar16 * fVar29 - fVar14 * fVar15;
    lVar10 = 0x594;
    lVar11 = 0x58c;
    goto LAB_00197c30;
  case RO_ZXY:
    fVar14 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[1];
    bVar16 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[1];
    bVar17 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[1];
    bVar19 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
    bVar21 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
    bVar24 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
LAB_00197902:
    fVar29 = bVar24 * bVar16 - bVar21 * bVar17;
    fVar15 = bVar19 * bVar17 - bVar24 * fVar14;
    auVar7._4_4_ = fVar15;
    auVar7._0_4_ = fVar29;
    auVar7._8_4_ = fVar14 * bVar21 - bVar19 * bVar16;
    auVar7._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar7;
    fVar13 = this->m_calculatedAxis[0].m_floats[2];
    auVar4._4_4_ = bVar24 * fVar29 - fVar13 * bVar19;
    auVar4._0_4_ = bVar21 * fVar13 - fVar15 * bVar24;
    auVar4._8_4_ = bVar19 * fVar15 - fVar29 * bVar21;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])this->m_calculatedAxis[1].m_floats = auVar4;
    fVar18 = fVar15 * bVar17 - bVar16 * fVar13;
    fVar13 = fVar14 * fVar13 - bVar17 * fVar29;
    fVar14 = bVar16 * fVar29 - fVar14 * fVar15;
    goto LAB_00197c26;
  case RO_ZYX:
    bVar16 = (this->m_calculatedTransformA).m_basis.m_el[0].m_floats[0];
    bVar17 = (this->m_calculatedTransformA).m_basis.m_el[1].m_floats[0];
    bVar19 = (this->m_calculatedTransformA).m_basis.m_el[2].m_floats[0];
    bVar21 = (this->m_calculatedTransformB).m_basis.m_el[0].m_floats[2];
    bVar24 = (this->m_calculatedTransformB).m_basis.m_el[1].m_floats[2];
    bVar25 = (this->m_calculatedTransformB).m_basis.m_el[2].m_floats[2];
    break;
  default:
    goto switchD_00197868_default;
  }
  fVar29 = bVar24 * bVar19 - bVar17 * bVar25;
  fVar15 = bVar25 * bVar16 - bVar19 * bVar21;
  auVar6._4_4_ = fVar15;
  auVar6._0_4_ = fVar29;
  auVar6._8_4_ = bVar21 * bVar17 - bVar16 * bVar24;
  auVar6._12_4_ = 0;
  *(undefined1 (*) [16])this->m_calculatedAxis[1].m_floats = auVar6;
  fVar14 = this->m_calculatedAxis[1].m_floats[2];
  auVar9._4_4_ = fVar14 * bVar21 - bVar25 * fVar29;
  auVar9._0_4_ = fVar15 * bVar25 - bVar24 * fVar14;
  auVar9._8_4_ = fVar29 * bVar24 - bVar21 * fVar15;
  auVar9._12_4_ = 0;
  *(undefined1 (*) [16])this->m_calculatedAxis[0].m_floats = auVar9;
  fVar18 = bVar17 * fVar14 - fVar15 * bVar19;
  fVar13 = fVar29 * bVar19 - fVar14 * bVar16;
  fVar14 = fVar15 * bVar16 - fVar29 * bVar17;
LAB_00197c26:
  lVar10 = 0x5a4;
  lVar11 = 0x59c;
LAB_00197c30:
  *(ulong *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar11 + -0x48) =
       CONCAT44(fVar13,fVar18);
  *(ulong *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar10 + -0x48) =
       (ulong)(uint)fVar14;
switchD_00197868_default:
  fVar14 = this->m_calculatedAxis[0].m_floats[0];
  fVar13 = this->m_calculatedAxis[0].m_floats[1];
  fVar18 = this->m_calculatedAxis[0].m_floats[2];
  fVar14 = fVar18 * fVar18 + fVar14 * fVar14 + fVar13 * fVar13;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  fVar14 = 1.0 / fVar14;
  uVar2 = *(undefined8 *)this->m_calculatedAxis[0].m_floats;
  *(ulong *)this->m_calculatedAxis[0].m_floats =
       CONCAT44(fVar14 * (float)((ulong)uVar2 >> 0x20),fVar14 * (float)uVar2);
  this->m_calculatedAxis[0].m_floats[2] = fVar14 * this->m_calculatedAxis[0].m_floats[2];
  fVar14 = this->m_calculatedAxis[1].m_floats[0];
  fVar13 = this->m_calculatedAxis[1].m_floats[1];
  fVar18 = this->m_calculatedAxis[1].m_floats[2];
  fVar14 = fVar18 * fVar18 + fVar14 * fVar14 + fVar13 * fVar13;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  fVar14 = 1.0 / fVar14;
  uVar2 = *(undefined8 *)this->m_calculatedAxis[1].m_floats;
  *(ulong *)this->m_calculatedAxis[1].m_floats =
       CONCAT44(fVar14 * (float)((ulong)uVar2 >> 0x20),fVar14 * (float)uVar2);
  this->m_calculatedAxis[1].m_floats[2] = fVar14 * this->m_calculatedAxis[1].m_floats[2];
  fVar14 = this->m_calculatedAxis[2].m_floats[0];
  fVar13 = this->m_calculatedAxis[2].m_floats[1];
  fVar18 = this->m_calculatedAxis[2].m_floats[2];
  fVar14 = fVar18 * fVar18 + fVar14 * fVar14 + fVar13 * fVar13;
  if (fVar14 < 0.0) {
    fVar14 = sqrtf(fVar14);
  }
  else {
    fVar14 = SQRT(fVar14);
  }
  fVar14 = 1.0 / fVar14;
  uVar2 = *(undefined8 *)this->m_calculatedAxis[2].m_floats;
  *(ulong *)this->m_calculatedAxis[2].m_floats =
       CONCAT44(fVar14 * (float)((ulong)uVar2 >> 0x20),fVar14 * (float)uVar2);
  this->m_calculatedAxis[2].m_floats[2] = fVar14 * this->m_calculatedAxis[2].m_floats[2];
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateAngleInfo()
{
	btMatrix3x3 relative_frame = m_calculatedTransformA.getBasis().inverse()*m_calculatedTransformB.getBasis();
	switch (m_rotateOrder)
	{
		case RO_XYZ : matrixToEulerXYZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_XZY : matrixToEulerXZY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YXZ : matrixToEulerYXZ(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_YZX : matrixToEulerYZX(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZXY : matrixToEulerZXY(relative_frame,m_calculatedAxisAngleDiff); break;
		case RO_ZYX : matrixToEulerZYX(relative_frame,m_calculatedAxisAngleDiff); break;
		default : btAssert(false);
	}
	// in euler angle mode we do not actually constrain the angular velocity
	// along the axes axis[0] and axis[2] (although we do use axis[1]) :
	//
	//    to get			constrain w2-w1 along		...not
	//    ------			---------------------		------
	//    d(angle[0])/dt = 0	ax[1] x ax[2]			ax[0]
	//    d(angle[1])/dt = 0	ax[1]
	//    d(angle[2])/dt = 0	ax[0] x ax[1]			ax[2]
	//
	// constraining w2-w1 along an axis 'a' means that a'*(w2-w1)=0.
	// to prove the result for angle[0], write the expression for angle[0] from
	// GetInfo1 then take the derivative. to prove this for angle[2] it is
	// easier to take the euler rate expression for d(angle[2])/dt with respect
	// to the components of w and set that to 0.
	switch (m_rotateOrder)
	{
	case RO_XYZ :
		{
			//Is this the "line of nodes" calculation choosing planes YZ (B coordinate system) and xy (A coordinate system)? (http://en.wikipedia.org/wiki/Euler_angles)
			//The two planes are non-homologous, so this is a Tait�Bryan angle formalism and not a proper Euler
			//Extrinsic rotations are equal to the reversed order intrinsic rotations so the above xyz extrinsic rotations (axes are fixed) are the same as the zy'x" intrinsic rotations (axes are refreshed after each rotation)
			//that is why xy and YZ planes are chosen (this will describe a zy'x" intrinsic rotation) (see the figure on the left at http://en.wikipedia.org/wiki/Euler_angles under Tait�Bryan angles)
			// x' = Nperp = N.cross(axis2)
			// y' = N = axis2.cross(axis0)	
			// z' = z
			//
			// x" = X
			// y" = y'
			// z" = ??
			//in other words:
			//first rotate around z
			//second rotate around y'= z.cross(X)
			//third rotate around x" = X
			//Original XYZ extrinsic rotation order. 
			//Planes: xy and YZ normals: z, X.  Plane intersection (N) is z.cross(X)
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	case RO_XZY :
		{
			//planes: xz,ZY normals: y, X
			//first rotate around y
			//second rotate around z'= y.cross(X)
			//third rotate around x" = X
			btVector3 axis0 = m_calculatedTransformB.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_YXZ :
		{
			//planes: yx,XZ normals: z, Y
			//first rotate around z
			//second rotate around x'= z.cross(Y)
			//third rotate around y" = Y
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformA.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_YZX :
		{
			//planes: yz,ZX normals: x, Y
			//first rotate around x
			//second rotate around z'= x.cross(Y)
			//third rotate around y" = Y
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis1 = m_calculatedTransformB.getBasis().getColumn(1);
			m_calculatedAxis[2] = axis0.cross(axis1);
			m_calculatedAxis[0] = axis1.cross(m_calculatedAxis[2]);
			m_calculatedAxis[1] = m_calculatedAxis[2].cross(axis0);
			break;
		}
	case RO_ZXY :
		{
			//planes: zx,XY normals: y, Z
			//first rotate around y
			//second rotate around x'= y.cross(Z)
			//third rotate around z" = Z
			btVector3 axis1 = m_calculatedTransformA.getBasis().getColumn(1);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[0] = axis1.cross(axis2);
			m_calculatedAxis[1] = axis2.cross(m_calculatedAxis[0]);
			m_calculatedAxis[2] = m_calculatedAxis[0].cross(axis1);
			break;
		}
	case RO_ZYX :
		{
			//planes: zy,YX normals: x, Z
			//first rotate around x
			//second rotate around y' = x.cross(Z)
			//third rotate around z" = Z
			btVector3 axis0 = m_calculatedTransformA.getBasis().getColumn(0);
			btVector3 axis2 = m_calculatedTransformB.getBasis().getColumn(2);
			m_calculatedAxis[1] = axis2.cross(axis0);
			m_calculatedAxis[0] = m_calculatedAxis[1].cross(axis2);
			m_calculatedAxis[2] = axis0.cross(m_calculatedAxis[1]);
			break;
		}
	default:
		btAssert(false);
	}

	m_calculatedAxis[0].normalize();
	m_calculatedAxis[1].normalize();
	m_calculatedAxis[2].normalize();

}